

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  allocator<char> local_d6;
  allocator<char> local_d5;
  TestShaderType local_d4;
  string local_d0 [32];
  string shader_source;
  string example_struct;
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_struct,
             "struct light {\n    float[2] intensity;\n    int[2] position;\n};\n",
             (allocator<char> *)&shader_source);
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  local_d4 = tested_shader_type;
  std::__cxx11::string::_M_assign((string *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"    light my_light_object",&local_d5)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"[2]",&local_d6);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_50,this,local_d0,local_70,1);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::append((char *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_d4) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x594);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b6fd10::switchdataD_0171b5f8 +
         (long)(int)(&switchD_00b6fd10::switchdataD_0171b5f8)[tested_shader_type]) {
  case 0xb6fd12:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb6fd23:
  case 0xb6fd2a:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_0171b610 + *(int *)(&DAT_0171b610 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void SizedDeclarationsStructTypes3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float[2] intensity;\n"
							   "    int[2] position;\n"
							   "};\n");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;
		shader_source += shader_start;
		shader_source += this->extend_string("    light my_light_object", "[2]", max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}